

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QToolBarItem_*>::begin(QList<QToolBarItem_*> *this)

{
  QToolBarItem **n;
  QArrayDataPointer<QToolBarItem_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QToolBarItem_*> *)0x700309);
  QArrayDataPointer<QToolBarItem_*>::operator->(in_RDI);
  n = QArrayDataPointer<QToolBarItem_*>::begin((QArrayDataPointer<QToolBarItem_*> *)0x70031a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }